

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

void fill_align_prices(lzma_lzma1_encoder *coder)

{
  uint32_t uVar1;
  uint local_14;
  uint32_t i;
  lzma_lzma1_encoder *coder_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    uVar1 = rc_bittree_reverse_price(coder->dist_align,4,local_14);
    coder->align_prices[local_14] = uVar1;
  }
  coder->align_price_count = 0;
  return;
}

Assistant:

static void
fill_align_prices(lzma_lzma1_encoder *coder)
{
	for (uint32_t i = 0; i < ALIGN_SIZE; ++i)
		coder->align_prices[i] = rc_bittree_reverse_price(
				coder->dist_align, ALIGN_BITS, i);

	coder->align_price_count = 0;
	return;
}